

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_lqarx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 val;
  TCGv_i64 val_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGMemOpIdx TVar3;
  TCGv_i64 EA_00;
  TCGv_i32 ret;
  bool bVar4;
  TCGv_i32 oi;
  TCGv_i64 lo;
  TCGv_i64 hi;
  TCGv_i64 EA;
  int rd;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rD(ctx->opcode);
  bVar4 = true;
  if ((uVar1 & 1) == 0) {
    uVar2 = rA(ctx->opcode);
    bVar4 = true;
    if (uVar1 != uVar2) {
      uVar2 = rB(ctx->opcode);
      bVar4 = uVar1 == uVar2;
    }
  }
  if (bVar4) {
    gen_inval_exception(ctx,1);
  }
  else {
    gen_set_access_type(ctx,0x40);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    val = cpu_gpr[(int)(uVar1 + 1)];
    val_00 = cpu_gpr[(int)uVar1];
    uVar1 = tb_cflags((ctx->base).tb);
    if ((uVar1 & 0x80000) == 0) {
      if ((ctx->le_mode & 1U) == 0) {
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val_00,EA_00,(long)ctx->mem_idx,MO_ALIGN_16|MO_BEQ);
        tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_reserve,EA_00);
        gen_addr_add(ctx,EA_00,EA_00,8);
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val,EA_00,(long)ctx->mem_idx,MO_BEQ);
      }
      else {
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val,EA_00,(long)ctx->mem_idx,MO_ALIGN_16|MO_64);
        tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_reserve,EA_00);
        gen_addr_add(ctx,EA_00,EA_00,8);
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val_00,EA_00,(long)ctx->mem_idx,MO_64);
      }
    }
    else {
      ret = tcg_temp_new_i32(tcg_ctx_00);
      if ((ctx->le_mode & 1U) == 0) {
        TVar3 = make_memop_idx(MO_ALIGN_16|MO_BEQ,ctx->mem_idx);
        tcg_gen_movi_i32(tcg_ctx_00,ret,TVar3);
        gen_helper_lq_be_parallel(tcg_ctx_00,val,tcg_ctx_00->cpu_env,EA_00,ret);
      }
      else {
        TVar3 = make_memop_idx(MO_ALIGN_16|MO_64,ctx->mem_idx);
        tcg_gen_movi_i32(tcg_ctx_00,ret,TVar3);
        gen_helper_lq_le_parallel(tcg_ctx_00,val,tcg_ctx_00->cpu_env,EA_00,ret);
      }
      tcg_temp_free_i32(tcg_ctx_00,ret);
      tcg_gen_ld_i64_ppc64(tcg_ctx_00,val_00,tcg_ctx_00->cpu_env,0x2b0);
    }
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_gen_st_i64_ppc64(tcg_ctx_00,val_00,tcg_ctx_00->cpu_env,0x270);
    tcg_gen_st_i64_ppc64(tcg_ctx_00,val,tcg_ctx_00->cpu_env,0x278);
  }
  return;
}

Assistant:

static void gen_lqarx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd = rD(ctx->opcode);
    TCGv EA, hi, lo;

    if (unlikely((rd & 1) || (rd == rA(ctx->opcode)) ||
                 (rd == rB(ctx->opcode)))) {
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        return;
    }

    gen_set_access_type(ctx, ACCESS_RES);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);

    /* Note that the low part is always in RD+1, even in LE mode.  */
    lo = cpu_gpr[rd + 1];
    hi = cpu_gpr[rd];

    if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
        if (HAVE_ATOMIC128) {
            TCGv_i32 oi = tcg_temp_new_i32(tcg_ctx);
            if (ctx->le_mode) {
                tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_LEQ | MO_ALIGN_16,
                                                    ctx->mem_idx));
                gen_helper_lq_le_parallel(tcg_ctx, lo, tcg_ctx->cpu_env, EA, oi);
            } else {
                tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_BEQ | MO_ALIGN_16,
                                                    ctx->mem_idx));
                gen_helper_lq_be_parallel(tcg_ctx, lo, tcg_ctx->cpu_env, EA, oi);
            }
            tcg_temp_free_i32(tcg_ctx, oi);
            tcg_gen_ld_i64(tcg_ctx, hi, tcg_ctx->cpu_env, offsetof(CPUPPCState, retxh));
        } else {
            /* Restart with exclusive lock.  */
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            ctx->base.is_jmp = DISAS_NORETURN;
            tcg_temp_free(tcg_ctx, EA);
            return;
        }
    } else if (ctx->le_mode) {
        tcg_gen_qemu_ld_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_LEQ | MO_ALIGN_16);
        tcg_gen_mov_tl(tcg_ctx, cpu_reserve, EA);
        gen_addr_add(ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_LEQ);
    } else {
        tcg_gen_qemu_ld_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_BEQ | MO_ALIGN_16);
        tcg_gen_mov_tl(tcg_ctx, cpu_reserve, EA);
        gen_addr_add(ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_BEQ);
    }
    tcg_temp_free(tcg_ctx, EA);

    tcg_gen_st_tl(tcg_ctx, hi, tcg_ctx->cpu_env, offsetof(CPUPPCState, reserve_val));
    tcg_gen_st_tl(tcg_ctx, lo, tcg_ctx->cpu_env, offsetof(CPUPPCState, reserve_val2));
}